

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.hpp
# Opt level: O0

void __thiscall
cpptrace::stacktrace_frame::stacktrace_frame(stacktrace_frame *this,stacktrace_frame *param_1)

{
  frame_ptr fVar1;
  nullable<unsigned_int,_0> nVar2;
  stacktrace_frame *param_1_local;
  stacktrace_frame *this_local;
  
  nVar2.raw_value = (param_1->column).raw_value;
  this->line = (nullable<unsigned_int,_0>)(param_1->line).raw_value;
  this->column = (nullable<unsigned_int,_0>)nVar2.raw_value;
  fVar1 = param_1->object_address;
  this->raw_address = param_1->raw_address;
  this->object_address = fVar1;
  std::__cxx11::string::string((string *)&this->filename,(string *)&param_1->filename);
  std::__cxx11::string::string((string *)&this->symbol,(string *)&param_1->symbol);
  this->is_inline = (bool)(param_1->is_inline & 1);
  return;
}

Assistant:

struct CPPTRACE_EXPORT stacktrace_frame {
        frame_ptr raw_address;
        frame_ptr object_address;
        nullable<std::uint32_t> line;
        nullable<std::uint32_t> column;
        std::string filename;
        std::string symbol;
        bool is_inline;

        bool operator==(const stacktrace_frame& other) const {
            return raw_address == other.raw_address
                && object_address == other.object_address
                && line == other.line
                && column == other.column
                && filename == other.filename
                && symbol == other.symbol;
        }

        bool operator!=(const stacktrace_frame& other) const {
            return !operator==(other);
        }

        object_frame get_object_info() const;

        std::string to_string() const;
        friend std::ostream& operator<<(std::ostream& stream, const stacktrace_frame& frame);
    }